

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

ssize_t __thiscall pybind11::array::strides(array *this,ssize_t dim)

{
  ssize_t dim_00;
  ssize_t sVar1;
  ssize_t *psVar2;
  allocator<char> local_39;
  string local_38;
  ssize_t local_18;
  ssize_t dim_local;
  array *this_local;
  
  local_18 = dim;
  dim_local = (ssize_t)this;
  sVar1 = ndim(this);
  dim_00 = local_18;
  if (sVar1 <= dim) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"invalid axis",&local_39)
    ;
    fail_dim_check(this,dim_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  psVar2 = strides(this);
  return psVar2[local_18];
}

Assistant:

ssize_t strides(ssize_t dim) const {
        if (dim >= ndim())
            fail_dim_check(dim, "invalid axis");
        return strides()[dim];
    }